

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Triangle(AMFImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  CAMFImporter_NodeElement *pNode;
  _List_node_base *p_Var8;
  runtime_error *this_00;
  undefined8 uVar9;
  CAMFImporter_NodeElement *pCVar10;
  string local_90;
  string local_70;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  CAMFImporter_NodeElement *local_40;
  uint local_34;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x68);
  pCVar10 = this->mNodeElement_Cur;
  pNode->Type = ENET_Triangle;
  (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
  uVar9 = 0;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar10;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_007de870;
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar5 == '\0') {
    local_40 = pNode;
    ParseHelper_Node_Enter(this,pNode);
    iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar5 == '\0') {
      local_50 = 0;
      local_48 = 0;
      local_4c = 0;
    }
    else {
      paVar2 = &local_90.field_2;
      local_4c = 0;
      local_48 = 0;
      local_50 = 0;
      local_44 = 0;
      local_34 = 0;
      do {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar5 == 1) {
          local_90._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"color","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (iVar5 == 0) {
            if ((local_34 & 1) != 0) {
              local_90._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"color","");
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"Only one color can be defined for <triangle>.","");
              Throw_MoreThanOnceDefined(this,&local_90,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != paVar2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
            }
            ParseNode_Color(this);
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            cVar4 = (char)iVar5;
            uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
            local_34 = (uint)uVar9;
          }
          else {
            local_90._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"texmap","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if (iVar5 == 0) {
              if ((local_44 & 1) != 0) {
                local_90._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"texmap","");
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_70,
                           "Only one texture coordinate can be defined for <triangle>.","");
                Throw_MoreThanOnceDefined(this,&local_90,&local_70);
LAB_00372db8:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != paVar2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              local_90._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"map","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar6 = std::__cxx11::string::compare((char *)&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != paVar2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar6 != 0) {
                local_90._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v1","");
                (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != paVar2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                if (iVar5 == 0) {
                  if ((local_50 & 1) != 0) {
                    local_90._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v1","");
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_70,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_90,&local_70);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != paVar2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                  }
                  uVar7 = XML_ReadNode_GetVal_AsU32(this);
                  local_40[1]._vptr_CAMFImporter_NodeElement = (_func_int **)(ulong)uVar7;
                  pCVar10 = local_40;
                  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                  cVar4 = (char)iVar5;
                  uVar9 = CONCAT71((int7)((ulong)pCVar10 >> 8),1);
                  local_50 = (uint)uVar9;
                }
                else {
                  local_90._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v2","");
                  (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar5 = std::__cxx11::string::compare((char *)&local_90);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != paVar2) {
                    operator_delete(local_90._M_dataplus._M_p,
                                    local_90.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar5 == 0) {
                    if ((local_48 & 1) != 0) {
                      local_90._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v2","");
                      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_70,"Only one component can be defined.","");
                      Throw_MoreThanOnceDefined(this,&local_90,&local_70);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_90._M_dataplus._M_p != paVar2) {
                        operator_delete(local_90._M_dataplus._M_p,
                                        local_90.field_2._M_allocated_capacity + 1);
                      }
                    }
                    uVar7 = XML_ReadNode_GetVal_AsU32(this);
                    *(ulong *)&local_40[1].Type = (ulong)uVar7;
                    pCVar10 = local_40;
                    iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                    cVar4 = (char)iVar5;
                    uVar9 = CONCAT71((int7)((ulong)pCVar10 >> 8),1);
                    local_48 = (uint)uVar9;
                  }
                  else {
                    local_90._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v3","");
                    (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar5 = std::__cxx11::string::compare((char *)&local_90);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != paVar2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    if (iVar5 != 0) {
                      local_90._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_90,"triangle","");
                      XML_CheckNode_SkipUnsupported(this,&local_90);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_90._M_dataplus._M_p != paVar2) {
                        operator_delete(local_90._M_dataplus._M_p,
                                        local_90.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_00372c55;
                    }
                    if ((local_4c & 1) != 0) {
                      local_90._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v3","");
                      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_70,"Only one component can be defined.","");
                      Throw_MoreThanOnceDefined(this,&local_90,&local_70);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_90._M_dataplus._M_p != paVar2) {
                        operator_delete(local_90._M_dataplus._M_p,
                                        local_90.field_2._M_allocated_capacity + 1);
                      }
                    }
                    uVar7 = XML_ReadNode_GetVal_AsU32(this);
                    local_40[1].ID._M_dataplus._M_p = (pointer)(ulong)uVar7;
                    pCVar10 = local_40;
                    iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                    cVar4 = (char)iVar5;
                    uVar9 = CONCAT71((int7)((ulong)pCVar10 >> 8),1);
                    local_4c = (uint)uVar9;
                  }
                }
                goto LAB_00372c62;
              }
              if ((local_44 & 1) != 0) {
                local_90._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"map","");
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_70,
                           "Only one texture coordinate can be defined for <triangle>.","");
                Throw_MoreThanOnceDefined(this,&local_90,&local_70);
                goto LAB_00372db8;
              }
            }
            ParseNode_TexMap(this,iVar5 != 0);
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            cVar4 = (char)iVar5;
            uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
            local_44 = (uint)uVar9;
          }
        }
        else {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar5 == 2) {
            local_90._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"triangle","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            pNode = local_40;
            if (iVar5 == 0) goto LAB_00373080;
          }
LAB_00372c55:
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          cVar4 = (char)iVar5;
        }
LAB_00372c62:
      } while (cVar4 != '\0');
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"triangle","");
    Throw_CloseNotFound(this,&local_90);
    pNode = local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
LAB_00373080:
    uVar3 = local_50;
    ParseHelper_Node_Exit(this);
    if ((((uVar3 & 1) == 0) || ((local_48 & 1) == 0)) || ((char)local_4c == '\0')) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Not all vertices of the triangle are defined.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_90);
      *(undefined ***)this_00 = &PTR__runtime_error_007dd738;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pCVar10 = this->mNodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar10->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void AMFImporter::ParseNode_Triangle()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Triangle(mNodeElement_Cur);

	CAMFImporter_NodeElement_Triangle& als = *((CAMFImporter_NodeElement_Triangle*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false, tex_read = false;
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("triangle");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("texmap"))// new name of node: "texmap".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("texmap", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap();
				tex_read = true;

				continue;
			}
			else if(XML_CheckNode_NameEqual("map"))// old name of node: "map".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("map", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap(true);
				tex_read = true;

				continue;
			}

			MACRO_NODECHECK_READCOMP_U32("v1", read_flag[0], als.V[0]);
			MACRO_NODECHECK_READCOMP_U32("v2", read_flag[1], als.V[1]);
			MACRO_NODECHECK_READCOMP_U32("v3", read_flag[2], als.V[2]);
		MACRO_NODECHECK_LOOPEND("triangle");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all vertices of the triangle are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}